

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RC interp(NODE *n)

{
  NODE *n_00;
  int iVar1;
  AttrType AVar2;
  RC RVar3;
  node *pnVar4;
  size_t sVar5;
  anon_union_40_19_873d29c6_for_u *paVar6;
  node *pnVar7;
  char **ppcVar8;
  Condition *extraout_RDX;
  Condition *extraout_RDX_00;
  Condition *conditions;
  Condition *extraout_RDX_01;
  char *pcVar9;
  char *pcVar10;
  int i;
  long lVar11;
  int *piVar12;
  int i_1;
  AttrInfo *value;
  long lVar13;
  RelAttr local_cc8;
  Value rhsValue;
  RelAttr relAttrs [40];
  AttrInfo attrInfos [40];
  
  iVar1 = isatty(0);
  conditions = extraout_RDX;
  if (iVar1 != 0) goto LAB_00116ffb;
  switch(n->kind) {
  case N_CREATETABLE:
    printf("create table %s (",(n->u).CREATETABLE.relname);
    paVar6 = &n->u;
    do {
      pnVar7 = (paVar6->CREATETABLE).attrlist;
      do {
        pnVar4 = pnVar7;
        if (pnVar4 == (node *)0x0) {
          putchar(0x29);
          goto LAB_00116fe0;
        }
        pnVar7 = (pnVar4->u).QUERY.relattrlist;
        printf("%s = %s",(pnVar7->u).CREATETABLE.relname,(pnVar7->u).CREATETABLE.attrlist);
        pnVar7 = (node *)0x0;
      } while ((pnVar4->u).CREATETABLE.attrlist == (node *)0x0);
      paVar6 = &pnVar4->u;
      printf(", ");
    } while( true );
  case N_CREATEINDEX:
    pcVar10 = (n->u).CREATETABLE.relname;
    pnVar7 = (n->u).CREATETABLE.attrlist;
    pcVar9 = "create index %s(%s);\n";
    break;
  case N_DROPTABLE:
    pcVar10 = (n->u).CREATETABLE.relname;
    pcVar9 = "drop table %s;\n";
    goto LAB_00116e55;
  case N_DROPINDEX:
    pcVar10 = (n->u).CREATETABLE.relname;
    pnVar7 = (n->u).CREATETABLE.attrlist;
    pcVar9 = "drop index %s(%s);\n";
    break;
  case N_LOAD:
    pcVar10 = (n->u).CREATETABLE.relname;
    pnVar7 = (n->u).CREATETABLE.attrlist;
    pcVar9 = "load %s(\"%s\");\n";
    break;
  case N_SET:
    pcVar10 = (n->u).CREATETABLE.relname;
    pnVar7 = (n->u).CREATETABLE.attrlist;
    pcVar9 = "set %s = \"%s\";\n";
    break;
  case N_HELP:
    printf("help");
    if ((n->u).CREATETABLE.relname != (char *)0x0) {
      printf(" %s");
    }
    goto LAB_00116fe0;
  case N_PRINT:
    pcVar10 = (n->u).CREATETABLE.relname;
    pcVar9 = "print %s;\n";
LAB_00116e55:
    printf(pcVar9,pcVar10);
    goto switchD_00116d17_default;
  case N_QUERY:
    printf("select ");
    paVar6 = &n->u;
    do {
      pnVar7 = (paVar6->QUERY).relattrlist;
      do {
        pnVar4 = pnVar7;
        if (pnVar4 == (node *)0x0) {
          printf("\n from ");
          paVar6 = &n->u;
          goto LAB_00116f5d;
        }
        print_relattr((pnVar4->u).QUERY.relattrlist);
        pnVar7 = (node *)0x0;
      } while ((pnVar4->u).CREATETABLE.attrlist == (node *)0x0);
      paVar6 = (anon_union_40_19_873d29c6_for_u *)&(pnVar4->u).CONDITION.op;
      putchar(0x2c);
    } while( true );
  case N_INSERT:
    printf("insert into %s values ( ",(n->u).CREATETABLE.relname);
    paVar6 = &n->u;
    do {
      pnVar7 = (paVar6->CREATETABLE).attrlist;
      do {
        pnVar4 = pnVar7;
        if (pnVar4 == (node *)0x0) {
          pcVar10 = ");";
          goto LAB_00116fe7;
        }
        print_value((pnVar4->u).QUERY.relattrlist);
        pnVar7 = (node *)0x0;
      } while ((pnVar4->u).CREATETABLE.attrlist == (node *)0x0);
      paVar6 = &pnVar4->u;
      putchar(0x2c);
    } while( true );
  case N_DELETE:
    printf("delete %s ",(n->u).CREATETABLE.relname);
    if ((n->u).CREATETABLE.attrlist != (node *)0x0) {
      printf("where ");
      pnVar7 = (n->u).CREATETABLE.attrlist;
LAB_00116fdb:
      print_conditions(pnVar7);
    }
    goto LAB_00116fe0;
  case N_UPDATE:
    printf("update %s set ",(n->u).CREATETABLE.relname);
    print_relattr((n->u).CREATETABLE.attrlist);
    printf(" = ");
    pnVar7 = (n->u).QUERY.conditionlist;
    n_00 = (pnVar7->u).QUERY.relattrlist;
    if (n_00 == (NODE *)0x0) {
      print_value((pnVar7->u).CREATETABLE.attrlist);
    }
    else {
      print_relattr(n_00);
    }
    if ((n->u).UPDATE.conditionlist != (node *)0x0) {
      printf("where ");
      pnVar7 = (n->u).UPDATE.conditionlist;
      goto LAB_00116fdb;
    }
LAB_00116fe0:
    pcVar10 = ";";
LAB_00116fe7:
    puts(pcVar10);
  default:
    goto switchD_00116d17_default;
  }
  printf(pcVar9,pcVar10,pnVar7);
switchD_00116d17_default:
  fflush(_stdout);
  conditions = extraout_RDX_00;
LAB_00116ffb:
  switch(n->kind) {
  case N_CREATETABLE:
    sVar5 = strlen((n->u).CREATETABLE.relname);
    if (0x18 < sVar5) {
      pcVar10 = "create";
      iVar1 = -9;
      goto LAB_00117466;
    }
    pnVar7 = (n->u).CREATETABLE.attrlist;
    piVar12 = &attrInfos[0].attrLength;
    lVar11 = 0;
    while( true ) {
      if (pnVar7 == (node *)0x0) {
        RVar3 = SM_Manager::CreateTable(pSmm,(n->u).CREATETABLE.relname,(int)lVar11,attrInfos);
        return RVar3;
      }
      if (lVar11 == 0x28) break;
      pnVar4 = (pnVar7->u).QUERY.relattrlist;
      sVar5 = strlen((pnVar4->u).CREATETABLE.relname);
      if (0x18 < sVar5) {
        RVar3 = -9;
        goto LAB_001174fb;
      }
      iVar1 = __isoc99_sscanf((pnVar4->u).CREATETABLE.attrlist,"%c%d",&rhsValue,relAttrs);
      if (iVar1 != 2) {
        if (iVar1 == 1) {
          if ((undefined1)rhsValue.type == 0x66) {
LAB_0011731a:
            AVar2 = FLOAT;
          }
          else if ((undefined1)rhsValue.type == 0x69) {
            AVar2 = INT;
          }
          else {
            if ((undefined1)rhsValue.type != 0x6d) {
              if ((undefined1)rhsValue.type != 0x72) {
                if ((undefined1)rhsValue.type == 99) {
                  RVar3 = -3;
                }
                else {
                  RVar3 = -3;
                  if ((undefined1)rhsValue.type != 0x73) goto LAB_001174f8;
                }
                goto LAB_001174fb;
              }
              goto LAB_0011731a;
            }
            AVar2 = MBR;
          }
          relAttrs[0].relName = (char *)CONCAT44(relAttrs[0].relName._4_4_,4);
          iVar1 = 4;
          goto LAB_001173a6;
        }
LAB_001174f8:
        RVar3 = -6;
        goto LAB_001174fb;
      }
      if ((undefined1)rhsValue.type == 99) {
LAB_0011735d:
        AVar2 = STRING;
        iVar1 = (int)relAttrs[0].relName;
        if ((int)relAttrs[0].relName - 0x100U < 0xffffff01) {
          RVar3 = -7;
          goto LAB_001174fb;
        }
      }
      else if ((undefined1)rhsValue.type == 0x66) {
LAB_0011737a:
        AVar2 = FLOAT;
        iVar1 = 4;
        if ((int)relAttrs[0].relName != 4) {
          RVar3 = -5;
          goto LAB_001174fb;
        }
      }
      else {
        if ((undefined1)rhsValue.type == 0x73) goto LAB_0011735d;
        if ((undefined1)rhsValue.type == 0x6d) {
          AVar2 = MBR;
          iVar1 = 4;
          if ((int)relAttrs[0].relName != 4) {
            RVar3 = -0xb;
            goto LAB_001174fb;
          }
        }
        else {
          if ((undefined1)rhsValue.type == 0x72) goto LAB_0011737a;
          if ((undefined1)rhsValue.type != 0x69) goto LAB_001174f8;
          AVar2 = INT;
          iVar1 = 4;
          if ((int)relAttrs[0].relName != 4) {
            RVar3 = -4;
            goto LAB_001174fb;
          }
        }
      }
LAB_001173a6:
      ((AttrInfo *)(piVar12 + -3))->attrName = (pnVar4->u).CREATETABLE.relname;
      piVar12[-1] = AVar2;
      *piVar12 = iVar1;
      lVar11 = lVar11 + 1;
      pnVar7 = (pnVar7->u).CREATETABLE.attrlist;
      piVar12 = piVar12 + 4;
    }
    RVar3 = -2;
LAB_001174fb:
    pcVar10 = "create";
    break;
  case N_CREATEINDEX:
    RVar3 = SM_Manager::CreateIndex(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    return RVar3;
  case N_DROPTABLE:
    RVar3 = SM_Manager::DropTable(pSmm,(n->u).CREATETABLE.relname);
    return RVar3;
  case N_DROPINDEX:
    RVar3 = SM_Manager::DropIndex(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    return RVar3;
  case N_LOAD:
    RVar3 = SM_Manager::Load(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    return RVar3;
  case N_SET:
    RVar3 = SM_Manager::Set(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    return RVar3;
  case N_HELP:
    pcVar10 = (n->u).CREATETABLE.relname;
    if (pcVar10 != (char *)0x0) {
      RVar3 = SM_Manager::Help(pSmm,pcVar10);
      return RVar3;
    }
    RVar3 = SM_Manager::Help(pSmm);
    return RVar3;
  case N_PRINT:
    RVar3 = SM_Manager::Print(pSmm,(n->u).CREATETABLE.relname);
    return RVar3;
  case N_QUERY:
    ppcVar8 = &relAttrs[0].attrName;
    lVar11 = 0;
    paVar6 = &n->u;
    while (pnVar7 = (paVar6->QUERY).relattrlist, pnVar7 != (node *)0x0) {
      if (lVar11 == 0x28) goto LAB_00117280;
      pnVar4 = (pnVar7->u).QUERY.relattrlist;
      ((RelAttr *)(ppcVar8 + -1))->relName = (pnVar4->u).CREATETABLE.relname;
      conditions = (Condition *)(pnVar4->u).CREATETABLE.attrlist;
      *ppcVar8 = (char *)conditions;
      lVar11 = lVar11 + 1;
      ppcVar8 = ppcVar8 + 2;
      paVar6 = (anon_union_40_19_873d29c6_for_u *)&(pnVar7->u).CONDITION.op;
    }
    lVar13 = 0;
    pnVar7 = n;
    while (pnVar7 = (pnVar7->u).CREATETABLE.attrlist, pnVar7 != (node *)0x0) {
      if (lVar13 == 0x28) goto LAB_00117280;
      *(char **)(&rhsValue.type + lVar13 * 2) =
           (((pnVar7->u).QUERY.relattrlist)->u).CREATETABLE.relname;
      lVar13 = lVar13 + 1;
    }
    RVar3 = mk_conditions((n->u).QUERY.conditionlist,(int)(Condition *)attrInfos,conditions);
    if (-1 < RVar3) {
      RVar3 = QL_Manager::Select(pQlm,(int)lVar11,relAttrs,(int)lVar13,(char **)&rhsValue,RVar3,
                                 (Condition *)attrInfos);
      return RVar3;
    }
    pcVar10 = "select";
    break;
  case N_INSERT:
    value = attrInfos;
    lVar11 = 0;
    pnVar7 = n;
    while( true ) {
      pnVar7 = (pnVar7->u).CREATETABLE.attrlist;
      if (pnVar7 == (node *)0x0) {
        RVar3 = QL_Manager::Insert(pQlm,(n->u).CREATETABLE.relname,(int)lVar11,(Value *)attrInfos);
        return RVar3;
      }
      if (lVar11 == 0x28) break;
      mk_value((pnVar7->u).QUERY.relattrlist,(Value *)value);
      lVar11 = lVar11 + 1;
      value = value + 1;
    }
    pcVar10 = "insert";
LAB_001173e5:
    RVar3 = -2;
    break;
  case N_DELETE:
    iVar1 = mk_conditions((n->u).CREATETABLE.attrlist,(int)attrInfos,conditions);
    if (-1 < iVar1) {
      RVar3 = QL_Manager::Delete(pQlm,(n->u).CREATETABLE.relname,iVar1,(Condition *)attrInfos);
      return RVar3;
    }
    pcVar10 = "delete";
LAB_00117466:
    print_error(pcVar10,iVar1);
    return 0;
  case N_UPDATE:
    pnVar7 = (n->u).CREATETABLE.attrlist;
    relAttrs[0].relName = (pnVar7->u).CREATETABLE.relname;
    relAttrs[0].attrName = (pnVar7->u).CREATEINDEX.attrname;
    pnVar7 = (n->u).QUERY.conditionlist;
    pnVar4 = (pnVar7->u).QUERY.relattrlist;
    if (pnVar4 == (node *)0x0) {
      mk_value((pnVar7->u).CREATETABLE.attrlist,&rhsValue);
      conditions = extraout_RDX_01;
    }
    else {
      local_cc8.relName = (pnVar4->u).CREATETABLE.relname;
      local_cc8.attrName = (char *)(pnVar4->u).CREATETABLE.attrlist;
    }
    RVar3 = mk_conditions((n->u).UPDATE.conditionlist,(int)(Condition *)attrInfos,conditions);
    if (-1 < RVar3) {
      RVar3 = QL_Manager::Update(pQlm,(n->u).CREATETABLE.relname,relAttrs,
                                 (uint)(pnVar4 == (node *)0x0),&local_cc8,&rhsValue,RVar3,
                                 (Condition *)attrInfos);
      return RVar3;
    }
    pcVar10 = "update";
    break;
  default:
    goto switchD_00117015_default;
  }
  print_error(pcVar10,RVar3);
switchD_00117015_default:
  return 0;
LAB_00116f5d:
  pnVar7 = (paVar6->CREATETABLE).attrlist;
  do {
    pnVar4 = pnVar7;
    if (pnVar4 == (node *)0x0) {
      putchar(10);
      if ((n->u).QUERY.conditionlist == (node *)0x0) goto LAB_00116fe0;
      printf("where ");
      pnVar7 = (n->u).QUERY.conditionlist;
      goto LAB_00116fdb;
    }
    printf(" %s",(((pnVar4->u).QUERY.relattrlist)->u).CREATETABLE.relname);
    pnVar7 = (node *)0x0;
  } while ((pnVar4->u).CREATETABLE.attrlist == (node *)0x0);
  paVar6 = &pnVar4->u;
  putchar(0x2c);
  goto LAB_00116f5d;
LAB_00117280:
  pcVar10 = "select";
  goto LAB_001173e5;
}

Assistant:

RC interp(NODE *n)
{
   RC errval = 0;         /* returned error value      */

   /* if input not coming from a terminal, then echo the query */
   if(!isatty(0))
      echo_query(n);

   switch(n -> kind){

      case N_CREATETABLE:            /* for CreateTable() */
         {
            int nattrs;
            AttrInfo attrInfos[MAXATTRS];

            /* Make sure relation name isn't too long */
            if(strlen(n -> u.CREATETABLE.relname) > MAXNAME){
               print_error((char*)"create", E_TOOLONG);
               break;
            }

            /* Make a list of AttrInfos suitable for sending to Create */
            nattrs = mk_attr_infos(n -> u.CREATETABLE.attrlist, MAXATTRS, 
                  attrInfos);
            if(nattrs < 0){
               print_error((char*)"create", nattrs);
               break;
            }

            /* Make the call to create */
            errval = pSmm->CreateTable(n->u.CREATETABLE.relname, nattrs, 
                  attrInfos);
            break;
         }   

      case N_CREATEINDEX:            /* for CreateIndex() */

         errval = pSmm->CreateIndex(n->u.CREATEINDEX.relname,
               n->u.CREATEINDEX.attrname);
         break;

      case N_DROPINDEX:            /* for DropIndex() */

         errval = pSmm->DropIndex(n->u.DROPINDEX.relname,
               n->u.DROPINDEX.attrname);
         break;

      case N_DROPTABLE:            /* for DropTable() */

         errval = pSmm->DropTable(n->u.DROPTABLE.relname);
         break;

      case N_LOAD:            /* for Load() */

         errval = pSmm->Load(n->u.LOAD.relname,
               n->u.LOAD.filename);
         break;

      case N_SET:                    /* for Set() */

         errval = pSmm->Set(n->u.SET.paramName,
               n->u.SET.string);
         break;

      case N_HELP:            /* for Help() */

         if (n->u.HELP.relname)
            errval = pSmm->Help(n->u.HELP.relname);
         else
            errval = pSmm->Help();
         break;

      case N_PRINT:            /* for Print() */

         errval = pSmm->Print(n->u.PRINT.relname);
         break;

      case N_QUERY:            /* for Query() */
         {
            int       nSelAttrs = 0;
            RelAttr  relAttrs[MAXATTRS];
            int       nRelations = 0;
            char      *relations[MAXATTRS];
            int       nConditions = 0;
            Condition conditions[MAXATTRS];

            /* Make a list of RelAttrs suitable for sending to Query */
            nSelAttrs = mk_rel_attrs(n->u.QUERY.relattrlist, MAXATTRS,
                  relAttrs);
            if(nSelAttrs < 0){
               print_error((char*)"select", nSelAttrs);
               break;
            }

            /* Make a list of relation names suitable for sending to Query */
            nRelations = mk_relations(n->u.QUERY.rellist, MAXATTRS, relations);
            if(nRelations < 0){
               print_error((char*)"select", nRelations);
               break;
            }

            /* Make a list of Conditions suitable for sending to Query */
            nConditions = mk_conditions(n->u.QUERY.conditionlist, MAXATTRS,
                  conditions);
            if(nConditions < 0){
               print_error((char*)"select", nConditions);
               break;
            }

            /* Make the call to Select */
            errval = pQlm->Select(nSelAttrs, relAttrs,
                  nRelations, relations,
                  nConditions, conditions);
            break;
         }   

      case N_INSERT:            /* for Insert() */
         {
            int nValues = 0;
            Value values[MAXATTRS];

            /* Make a list of Values suitable for sending to Insert */
            nValues = mk_values(n->u.INSERT.valuelist, MAXATTRS, values);
            if(nValues < 0){
               print_error((char*)"insert", nValues);
               break;
            }

            /* Make the call to insert */
            errval = pQlm->Insert(n->u.INSERT.relname,
                  nValues, values);
            break;
         }   

      case N_DELETE:            /* for Delete() */
         {
            int nConditions = 0;
            Condition conditions[MAXATTRS];

            /* Make a list of Conditions suitable for sending to delete */
            nConditions = mk_conditions(n->u.DELETE.conditionlist, MAXATTRS,
                  conditions);
            if(nConditions < 0){
               print_error((char*)"delete", nConditions);
               break;
            }

            /* Make the call to delete */
            errval = pQlm->Delete(n->u.DELETE.relname,
                  nConditions, conditions);
            break;
         }   

      case N_UPDATE:            /* for Update() */
         {
            RelAttr relAttr;

            // The RHS can be either a value or an attribute
            Value rhsValue;
            RelAttr rhsRelAttr;
            int bIsValue;

            int nConditions = 0;
            Condition conditions[MAXATTRS];

            /* Make a RelAttr suitable for sending to Update */
            mk_rel_attr(n->u.UPDATE.relattr, relAttr);

            struct node *rhs = n->u.UPDATE.relorvalue;
            if (rhs->u.RELATTR_OR_VALUE.relattr) {
               mk_rel_attr(rhs->u.RELATTR_OR_VALUE.relattr, rhsRelAttr);
               bIsValue = 0;
            } else {
               /* Make a value suitable for sending to update */
               mk_value(rhs->u.RELATTR_OR_VALUE.value, rhsValue);
               bIsValue = 1;
            }

            /* Make a list of Conditions suitable for sending to Update */
            nConditions = mk_conditions(n->u.UPDATE.conditionlist, MAXATTRS,
                  conditions);
            if(nConditions < 0){
               print_error((char*)"update", nConditions);
               break;
            }

            /* Make the call to update */
            errval = pQlm->Update(n->u.UPDATE.relname, relAttr, bIsValue, 
                  rhsRelAttr, rhsValue, nConditions, conditions);
            break;
         }   

      default:   // should never get here
         break;
   }

   return (errval);
}